

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O1

_Bool plutovg_matrix_invert(plutovg_matrix_t *matrix,plutovg_matrix_t *inverse)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = matrix->a;
  fVar2 = matrix->b;
  fVar3 = matrix->d;
  fVar4 = matrix->c;
  fVar7 = fVar1 * fVar3 - fVar4 * fVar2;
  if ((inverse != (plutovg_matrix_t *)0x0) && ((fVar7 != 0.0 || (NAN(fVar7))))) {
    fVar8 = 1.0 / fVar7;
    fVar5 = matrix->e;
    fVar6 = matrix->f;
    inverse->a = fVar3 * fVar8;
    inverse->b = -fVar2 * fVar8;
    inverse->c = -fVar4 * fVar8;
    inverse->d = fVar1 * fVar8;
    inverse->e = (fVar4 * fVar6 - fVar5 * fVar3) * fVar8;
    inverse->f = (fVar2 * fVar5 - fVar6 * fVar1) * fVar8;
  }
  return (_Bool)(-(fVar7 != 0.0) & 1);
}

Assistant:

bool plutovg_matrix_invert(const plutovg_matrix_t* matrix, plutovg_matrix_t* inverse)
{
    float det = (matrix->a * matrix->d - matrix->b * matrix->c);
    if(det == 0.f)
        return false;
    if(inverse) {
        float inv_det = 1.f / det;
        float a = matrix->a * inv_det;
        float b = matrix->b * inv_det;
        float c = matrix->c * inv_det;
        float d = matrix->d * inv_det;
        float e = (matrix->c * matrix->f - matrix->d * matrix->e) * inv_det;
        float f = (matrix->b * matrix->e - matrix->a * matrix->f) * inv_det;
        plutovg_matrix_init(inverse, d, -b, -c, a, e, f);
    }

    return true;
}